

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::BitState<duckdb::string_t>,duckdb::string_t,duckdb::BitStringOrOperation>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  string_t *idata;
  BitState<duckdb::string_t> **states_00;
  UnifiedVectorFormat sdata;
  AggregateUnaryInput input_data;
  SelectionVector *local_b8;
  BitState<duckdb::string_t> **local_b0;
  anon_union_16_2_67f50693_for_value local_70;
  ValidityMask local_60;
  
  if (*input == (Vector)0x0) {
    if (*states == (Vector)0x0) {
      idata = *(string_t **)(input + 0x20);
      states_00 = *(BitState<duckdb::string_t> ***)(states + 0x20);
      FlatVector::VerifyFlatVector(input);
      UnaryFlatLoop<duckdb::BitState<duckdb::string_t>,duckdb::string_t,duckdb::BitStringOrOperation>
                (idata,aggr_input_data,states_00,(ValidityMask *)(input + 0x28),count);
      return;
    }
  }
  else if ((*input == (Vector)0x2) && (*states == (Vector)0x2)) {
    if ((*(byte **)(input + 0x28) != (byte *)0x0) && ((**(byte **)(input + 0x28) & 1) == 0)) {
      return;
    }
    local_70.pointer.ptr = (char *)(input + 0x28);
    local_60.super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)0x0;
    local_70._0_8_ = aggr_input_data;
    BitwiseOperation::
    Operation<duckdb::string_t,duckdb::BitState<duckdb::string_t>,duckdb::BitStringOrOperation>
              ((BitwiseOperation *)**(undefined8 **)(states + 0x20),
               *(BitState<duckdb::string_t> **)(input + 0x20),(string_t *)&local_70.pointer,
               (AggregateUnaryInput *)count);
    return;
  }
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_70.pointer);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_b8);
  duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)states,(UnifiedVectorFormat *)count);
  UnaryScatterLoop<duckdb::BitState<duckdb::string_t>,duckdb::string_t,duckdb::BitStringOrOperation>
            ((string_t *)local_70.pointer.ptr,aggr_input_data,local_b0,
             (SelectionVector *)local_70._0_8_,local_b8,&local_60,count);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_b8);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_70.pointer);
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}